

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O0

void __thiscall
SamplerTest_bytes_until_sample_Overflow_Underflow_Test::TestBody
          (SamplerTest_bytes_until_sample_Overflow_Underflow_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  char *pcVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_2;
  Message local_180;
  unsigned_long local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  double local_158;
  ulong local_150;
  uint64_t largest_sample_step;
  undefined8 local_128;
  uint64_t smallest_prng_value;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  uint64_t cutoff;
  double local_e8;
  ulong local_e0;
  uint64_t smallest_sample_step;
  string local_a8;
  double local_88;
  double q;
  uint64_t largest_prng_value;
  uint64_t prng_mod_power;
  double sample_scaling;
  uint64_t sample_parameter;
  undefined8 uStack_58;
  int i;
  uint64_t sample_parameter_array [4];
  uint64_t one;
  Sampler sampler;
  SamplerTest_bytes_until_sample_Overflow_Underflow_Test *this_local;
  
  sampler._16_8_ = this;
  tcmalloc::Sampler::Sampler((Sampler *)&one);
  tcmalloc::Sampler::Init((Sampler *)&one,1);
  uStack_58 = 0;
  sample_parameter_array[0] = 1;
  sample_parameter_array[1] = 0x80000;
  sample_parameter_array[2] = 0x400000000000000;
  sample_parameter._4_4_ = 0;
  while( true ) {
    if (3 < sample_parameter._4_4_) {
      return;
    }
    sample_scaling = (double)sample_parameter_array[(long)sample_parameter._4_4_ + -1];
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"sample_parameter = ");
    std::ostream::operator<<(poVar2,(ulong)sample_scaling);
    dVar5 = log(2.0);
    auVar7._8_4_ = (int)((ulong)sample_scaling >> 0x20);
    auVar7._0_8_ = sample_scaling;
    auVar7._12_4_ = 0x45300000;
    prng_mod_power =
         (uint64_t)
         (-dVar5 * ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,SUB84(sample_scaling,0)) - 4503599627370496.0)));
    largest_prng_value = 0x30;
    q = 1.390671161566996e-309;
    local_88 = 67108864.0;
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    StringPrintf_abi_cxx11_(&local_a8,"q = %f\n",local_88);
    std::operator<<(poVar2,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    dVar5 = log(local_88);
    dVar6 = log(2.0);
    StringPrintf_abi_cxx11_((string *)&smallest_sample_step,"log2(q) = %f\n",dVar5 / dVar6);
    std::operator<<(poVar2,(string *)&smallest_sample_step);
    std::__cxx11::string::~string((string *)&smallest_sample_step);
    local_e8 = log2(local_88);
    local_e8 = local_e8 + -26.0;
    cutoff = 0;
    pdVar3 = std::min<double>(&local_e8,(double *)&cutoff);
    dVar5 = *pdVar3 * (double)prng_mod_power + 1.0;
    local_e0 = (ulong)dVar5;
    local_e0 = local_e0 | (long)(dVar5 - 9.223372036854776e+18) & (long)local_e0 >> 0x3f;
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"Smallest sample step is ");
    std::ostream::operator<<(poVar2,local_e0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(((ulong)sample_scaling / 0x1000000) * 10 + 10);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"Acceptable value is < ");
    std::ostream::operator<<
              (poVar2,(ulong)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_108,"smallest_sample_step","cutoff",&local_e0,
               (unsigned_long *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
                 ,0x186,pcVar4);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message(&local_110);
    }
    smallest_prng_value._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    if (smallest_prng_value._4_4_ != 0) {
      return;
    }
    local_128 = 0;
    local_88 = 1.0;
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    StringPrintf_abi_cxx11_((string *)&largest_sample_step,"q = %f\n",local_88);
    std::operator<<(poVar2,(string *)&largest_sample_step);
    std::__cxx11::string::~string((string *)&largest_sample_step);
    local_158 = log2(local_88);
    local_158 = local_158 + -26.0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    pdVar3 = std::min<double>(&local_158,(double *)&gtest_ar_1.message_);
    dVar5 = *pdVar3 * (double)prng_mod_power + 1.0;
    local_150 = (ulong)dVar5;
    local_150 = local_150 | (long)(dVar5 - 9.223372036854776e+18) & (long)local_150 >> 0x3f;
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar2 = std::operator<<(poVar2,"Largest sample step is ");
    std::ostream::operator<<(poVar2,local_150);
    local_178 = 0x8000000000000000;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_170,"largest_sample_step","one<<63",&local_150,&local_178);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
                 ,400,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_180);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_180);
    }
    smallest_prng_value._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    if (smallest_prng_value._4_4_ != 0) {
      return;
    }
    testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
              ((internal *)local_198,"largest_sample_step","smallest_sample_step",&local_150,
               &local_e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
                 ,0x191,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message(&local_1a0);
    }
    smallest_prng_value._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
    if (smallest_prng_value._4_4_ != 0) break;
    sample_parameter._4_4_ = sample_parameter._4_4_ + 1;
  }
  return;
}

Assistant:

TEST_F(SamplerTest, bytes_until_sample_Overflow_Underflow) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  uint64_t one = 1;
  // sample_parameter = 0;  // To test the edge case
  uint64_t sample_parameter_array[4] = {0, 1, one<<19, one<<58};
  for (int i = 0; i < 4; i++) {
    uint64_t sample_parameter = sample_parameter_array[i];
    LOG(INFO) << "sample_parameter = " << sample_parameter;
    double sample_scaling = - log(2.0) * sample_parameter;
    // Take the top 26 bits as the random number
    // (This plus the 1<<26 sampling bound give a max step possible of
    // 1209424308 bytes.)
    const uint64_t prng_mod_power = 48;  // Number of bits in prng

    // First, check the largest_prng value
    uint64_t largest_prng_value = (static_cast<uint64_t>(1)<<48) - 1;
    double q = (largest_prng_value >> (prng_mod_power - 26)) + 1.0;
    LOG(INFO) << StringPrintf("q = %f\n", q);
    LOG(INFO) << StringPrintf("log2(q) = %f\n", log(q)/log(2.0));
    uint64_t smallest_sample_step
      = static_cast<uint64_t>(std::min(log2(q) - 26, 0.0)
                              * sample_scaling + 1);
    LOG(INFO) << "Smallest sample step is " << smallest_sample_step;
    uint64_t cutoff = static_cast<uint64_t>(10)
                      * (sample_parameter/(one<<24) + 1);
    LOG(INFO) << "Acceptable value is < " << cutoff;
    // This checks that the answer is "small" and positive
    ASSERT_LE(smallest_sample_step, cutoff);

    // Next, check with the smallest prng value
    uint64_t smallest_prng_value = 0;
    q = (smallest_prng_value >> (prng_mod_power - 26)) + 1.0;
    LOG(INFO) << StringPrintf("q = %f\n", q);
    uint64_t largest_sample_step
      = static_cast<uint64_t>(std::min(log2(q) - 26, 0.0)
                              * sample_scaling + 1);
    LOG(INFO) << "Largest sample step is " << largest_sample_step;
    ASSERT_LE(largest_sample_step, one<<63);
    ASSERT_GE(largest_sample_step, smallest_sample_step);
  }
}